

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

SinkCombineResultType __thiscall
duckdb::PhysicalIEJoin::Combine
          (PhysicalIEJoin *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  LocalSinkState *pLVar1;
  reference this_00;
  pointer this_01;
  QueryProfiler *this_02;
  
  pLVar1 = input->local_state;
  this_00 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
            ::get<true>((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                         *)(input->global_state + 1),
                        *(size_type *)
                         ((long)&input->global_state[1].super_StateWithBlockableTasks.lock.
                                 super___mutex_base._M_mutex + 8));
  this_01 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator->(this_00);
  PhysicalRangeJoin::GlobalSortedTable::Combine(this_01,(LocalSortedTable *)(pLVar1 + 1));
  this_02 = QueryProfiler::Get(context->client);
  OperatorProfiler::Flush(&context->thread->profiler,(PhysicalOperator *)this);
  QueryProfiler::Flush(this_02,&context->thread->profiler);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalIEJoin::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<IEJoinGlobalState>();
	auto &lstate = input.local_state.Cast<IEJoinLocalState>();
	gstate.tables[gstate.child]->Combine(lstate.table);
	auto &client_profiler = QueryProfiler::Get(context.client);

	context.thread.profiler.Flush(*this);
	client_profiler.Flush(context.thread.profiler);

	return SinkCombineResultType::FINISHED;
}